

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O3

void per_scan_setup(j_compress_ptr cinfo)

{
  uint uVar1;
  jpeg_component_info *pjVar2;
  jpeg_error_mgr *pjVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  
  iVar8 = cinfo->comps_in_scan;
  if (iVar8 == 1) {
    pjVar2 = cinfo->cur_comp_info[0];
    cinfo->MCUs_per_row = pjVar2->width_in_blocks;
    uVar6 = pjVar2->height_in_blocks;
    cinfo->MCU_rows_in_scan = uVar6;
    pjVar2->MCU_width = 1;
    pjVar2->MCU_height = 1;
    pjVar2->MCU_blocks = 1;
    pjVar2->MCU_sample_width = pjVar2->DCT_h_scaled_size;
    pjVar2->last_col_width = 1;
    uVar6 = uVar6 % (uint)pjVar2->v_samp_factor;
    if (uVar6 == 0) {
      uVar6 = pjVar2->v_samp_factor;
    }
    pjVar2->last_row_height = uVar6;
    cinfo->blocks_in_MCU = 1;
    cinfo->MCU_membership[0] = 0;
  }
  else {
    if (iVar8 - 5U < 0xfffffffc) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x1b;
      (pjVar3->msg_parm).i[0] = iVar8;
      (cinfo->err->msg_parm).i[1] = 4;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    lVar4 = jdiv_round_up((ulong)cinfo->jpeg_width,
                          (long)cinfo->block_size * (long)cinfo->max_h_samp_factor);
    cinfo->MCUs_per_row = (JDIMENSION)lVar4;
    lVar4 = jdiv_round_up((ulong)cinfo->jpeg_height,
                          (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
    cinfo->MCU_rows_in_scan = (JDIMENSION)lVar4;
    cinfo->blocks_in_MCU = 0;
    if (0 < cinfo->comps_in_scan) {
      lVar4 = 0;
      do {
        pjVar2 = cinfo->cur_comp_info[lVar4];
        uVar6 = pjVar2->h_samp_factor;
        uVar1 = pjVar2->v_samp_factor;
        pjVar2->MCU_width = uVar6;
        pjVar2->MCU_height = uVar1;
        iVar8 = uVar1 * uVar6;
        pjVar2->MCU_blocks = iVar8;
        pjVar2->MCU_sample_width = pjVar2->DCT_h_scaled_size * uVar6;
        uVar7 = pjVar2->width_in_blocks % uVar6;
        if (uVar7 == 0) {
          uVar7 = uVar6;
        }
        pjVar2->last_col_width = uVar7;
        uVar6 = (uint)((ulong)pjVar2->height_in_blocks % (ulong)uVar1);
        if (uVar6 == 0) {
          uVar6 = uVar1;
        }
        pjVar2->last_row_height = uVar6;
        if (10 < cinfo->blocks_in_MCU + iVar8) {
          pjVar3 = cinfo->err;
          pjVar3->msg_code = 0xe;
          (*pjVar3->error_exit)((j_common_ptr)cinfo);
        }
        if (0 < iVar8) {
          uVar6 = iVar8 + 1;
          do {
            iVar8 = cinfo->blocks_in_MCU;
            cinfo->blocks_in_MCU = iVar8 + 1;
            cinfo->MCU_membership[iVar8] = (int)lVar4;
            uVar6 = uVar6 - 1;
          } while (1 < uVar6);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < cinfo->comps_in_scan);
    }
  }
  if (0 < (long)cinfo->restart_in_rows) {
    uVar5 = (ulong)cinfo->MCUs_per_row * (long)cinfo->restart_in_rows;
    if (0xfffe < uVar5) {
      uVar5 = 0xffff;
    }
    cinfo->restart_interval = (uint)uVar5;
  }
  return;
}

Assistant:

LOCAL(void)
per_scan_setup (j_compress_ptr cinfo)
/* Do computations that are needed before processing a JPEG scan */
/* cinfo->comps_in_scan and cinfo->cur_comp_info[] are already set */
{
  int ci, mcublks, tmp;
  jpeg_component_info *compptr;
  
  if (cinfo->comps_in_scan == 1) {
    
    /* Noninterleaved (single-component) scan */
    compptr = cinfo->cur_comp_info[0];
    
    /* Overall image size in MCUs */
    cinfo->MCUs_per_row = compptr->width_in_blocks;
    cinfo->MCU_rows_in_scan = compptr->height_in_blocks;
    
    /* For noninterleaved scan, always one block per MCU */
    compptr->MCU_width = 1;
    compptr->MCU_height = 1;
    compptr->MCU_blocks = 1;
    compptr->MCU_sample_width = compptr->DCT_h_scaled_size;
    compptr->last_col_width = 1;
    /* For noninterleaved scans, it is convenient to define last_row_height
     * as the number of block rows present in the last iMCU row.
     */
    tmp = (int) (compptr->height_in_blocks % compptr->v_samp_factor);
    if (tmp == 0) tmp = compptr->v_samp_factor;
    compptr->last_row_height = tmp;
    
    /* Prepare array describing MCU composition */
    cinfo->blocks_in_MCU = 1;
    cinfo->MCU_membership[0] = 0;
    
  } else {
    
    /* Interleaved (multi-component) scan */
    if (cinfo->comps_in_scan <= 0 || cinfo->comps_in_scan > MAX_COMPS_IN_SCAN)
      ERREXIT2(cinfo, JERR_COMPONENT_COUNT, cinfo->comps_in_scan,
	       MAX_COMPS_IN_SCAN);
    
    /* Overall image size in MCUs */
    cinfo->MCUs_per_row = (JDIMENSION)
      jdiv_round_up((long) cinfo->jpeg_width,
		    (long) (cinfo->max_h_samp_factor * cinfo->block_size));
    cinfo->MCU_rows_in_scan = (JDIMENSION)
      jdiv_round_up((long) cinfo->jpeg_height,
		    (long) (cinfo->max_v_samp_factor * cinfo->block_size));
    
    cinfo->blocks_in_MCU = 0;
    
    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      compptr = cinfo->cur_comp_info[ci];
      /* Sampling factors give # of blocks of component in each MCU */
      compptr->MCU_width = compptr->h_samp_factor;
      compptr->MCU_height = compptr->v_samp_factor;
      compptr->MCU_blocks = compptr->MCU_width * compptr->MCU_height;
      compptr->MCU_sample_width = compptr->MCU_width * compptr->DCT_h_scaled_size;
      /* Figure number of non-dummy blocks in last MCU column & row */
      tmp = (int) (compptr->width_in_blocks % compptr->MCU_width);
      if (tmp == 0) tmp = compptr->MCU_width;
      compptr->last_col_width = tmp;
      tmp = (int) (compptr->height_in_blocks % compptr->MCU_height);
      if (tmp == 0) tmp = compptr->MCU_height;
      compptr->last_row_height = tmp;
      /* Prepare array describing MCU composition */
      mcublks = compptr->MCU_blocks;
      if (cinfo->blocks_in_MCU + mcublks > C_MAX_BLOCKS_IN_MCU)
	ERREXIT(cinfo, JERR_BAD_MCU_SIZE);
      while (mcublks-- > 0) {
	cinfo->MCU_membership[cinfo->blocks_in_MCU++] = ci;
      }
    }
    
  }

  /* Convert restart specified in rows to actual MCU count. */
  /* Note that count must fit in 16 bits, so we provide limiting. */
  if (cinfo->restart_in_rows > 0) {
    long nominal = (long) cinfo->restart_in_rows * (long) cinfo->MCUs_per_row;
    cinfo->restart_interval = (unsigned int) MIN(nominal, 65535L);
  }
}